

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VincentyDestination.cpp
# Opt level: O1

LLPoint GeoCalcs::DestVincenty(LLPoint *pt,double brng,double dist)

{
  uint uVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  LLPoint LVar15;
  double local_70;
  double local_68;
  
  dVar3 = sin(brng);
  dVar4 = cos(brng);
  dVar5 = tan(pt->latitude);
  dVar5 = dVar5 * 0.99664718933526;
  dVar6 = dVar5 * dVar5 + 1.0;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  dVar6 = 1.0 / dVar6;
  dVar7 = atan2(dVar5,dVar4);
  dVar8 = dVar3 * dVar6;
  dVar9 = 1.0 - dVar8 * dVar8;
  dVar13 = (dVar9 * 272331606106.95312) / 40408299984662.05;
  dVar10 = dist / (((((dVar13 * -175.0 + 320.0) * dVar13 + -768.0) * dVar13 + 4096.0) *
                    dVar13 * 6.103515625e-05 + 1.0) * 6356752.314245227);
  local_68 = sin(dVar10);
  dVar11 = cos(dVar10);
  local_70 = cos(dVar7 + dVar7 + dVar10);
  dVar14 = dVar10;
  if (5e-16 < ABS(dVar10 + -6.283185307179586)) {
    dVar12 = (((dVar13 * -47.0 + 74.0) * dVar13 + -128.0) * dVar13 + 256.0) * dVar13 * 0.0009765625;
    dVar13 = dVar10;
    uVar1 = 0;
    do {
      local_70 = cos(dVar7 + dVar7 + dVar13);
      local_68 = sin(dVar13);
      dVar11 = cos(dVar13);
      dVar14 = local_70 * local_70;
      dVar14 = (((dVar14 + dVar14 + -1.0) * dVar11 +
                (dVar12 / -6.0) * local_70 * (local_68 * 4.0 * local_68 + -3.0) *
                (dVar14 * 4.0 + -3.0)) * dVar12 * 0.25 + local_70) * dVar12 * local_68 + dVar10;
      if (ABS(dVar14 - dVar13) <= 5e-16) break;
      bVar2 = uVar1 < 0x62;
      dVar13 = dVar14;
      uVar1 = uVar1 + 1;
    } while (bVar2);
  }
  dVar10 = dVar5 * dVar6 * local_68;
  dVar7 = dVar10 - dVar4 * dVar11 * dVar6;
  dVar7 = dVar8 * dVar8 + dVar7 * dVar7;
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  LVar15.latitude =
       atan2(dVar5 * dVar6 * dVar11 + dVar6 * local_68 * dVar4,dVar7 * 0.99664718933526);
  dVar3 = atan2(dVar3 * local_68,dVar11 * dVar6 - dVar4 * dVar10);
  dVar4 = ((dVar9 * -3.0 + 4.0) * 0.0033528106647399995 + 4.0) * dVar9 * 0.00020955066654624997;
  LVar15.longitude =
       dVar8 * (1.0 - dVar4) * -0.0033528106647399995 *
       ((((local_70 + local_70) * local_70 + -1.0) * dVar4 * dVar11 + local_70) * local_68 * dVar4 +
       dVar14) + dVar3 + pt->longitude;
  return LVar15;
}

Assistant:

LLPoint DestVincenty(const LLPoint &pt, double brng, double dist)
    {
        double s = dist;
        double alpha1 = brng;
        double sinAlpha1 = sin(alpha1);
        double cosAlpha1 = cos(alpha1);

        double tanU1 = (1.0 - kFlattening) * tan(pt.latitude);
        double cosU1 = 1.0 / sqrt((1.0 + tanU1 * tanU1));
        double sinU1 = tanU1 * cosU1;
        double sigma1 = atan2(tanU1, cosAlpha1);
        double sinAlpha = cosU1 * sinAlpha1;
        double cosSqAlpha = 1.0 - sinAlpha * sinAlpha;
        double uSq = cosSqAlpha * (kSemiMajorAxis * kSemiMajorAxis - kSemiMinorAxis * kSemiMinorAxis) /
                     (kSemiMinorAxis * kSemiMinorAxis);
        double A = 1.0 + uSq / 16384.0 * (4096.0 + uSq * (-768.0 + uSq * (320.0 - 175.0 * uSq)));
        double B = uSq / 1024.0 * (256.0 + uSq * (-128.0 + uSq * (74.0 - 47.0 * uSq)));

        double sigma = s / (kSemiMinorAxis * A);
        double sigmaP = M_2PI;
        double sinSigma = sin(sigma);
        double cosSigma = cos(sigma);
        double cos2SigmaM = cos(2.0 * sigma1 + sigma);
        int iterLimit = 0;
        while (fabs(sigma - sigmaP) > kEps && ++iterLimit < 100)
        {
            cos2SigmaM = cos(2.0 * sigma1 + sigma);
            sinSigma = sin(sigma);
            cosSigma = cos(sigma);
            double cos2SigmaSq = cos2SigmaM * cos2SigmaM;
            double deltaSigma = B * sinSigma * (cos2SigmaM + B * 0.25 * (cosSigma * (-1.0 + 2.0 * cos2SigmaSq) -
                                                                         B / 6.0 * cos2SigmaM *
                                                                         (-3.0 + 4.0 * sinSigma * sinSigma) *
                                                                         (-3.0 + 4.0 * cos2SigmaSq)));

            sigmaP = sigma;
            sigma = s / (kSemiMinorAxis * A) + deltaSigma;
        }

        double tmp = sinU1 * sinSigma - cosU1 * cosSigma * cosAlpha1;
        double lat2 = atan2(sinU1 * cosSigma + cosU1 * sinSigma * cosAlpha1,
                            (1.0 - kFlattening) * sqrt(sinAlpha * sinAlpha + tmp * tmp));
        double lambda = atan2(sinSigma * sinAlpha1, cosU1 * cosSigma - sinU1 * sinSigma * cosAlpha1);
        double C = kFlattening / 16.0 * cosSqAlpha * (4.0 + kFlattening * (4.0 - 3.0 * cosSqAlpha));
        double L = lambda - (1.0 - C) * kFlattening * sinAlpha *
                            (sigma +
                             C * sinSigma * (cos2SigmaM + C * cosSigma * (-1.0 + 2.0 * cos2SigmaM * cos2SigmaM)));

        return LLPoint(lat2, pt.longitude + L);
    }